

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__context *s;
  stbi__context *psVar2;
  undefined3 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  stbi_uc sVar9;
  int iVar10;
  stbi__uint32 sVar11;
  stbi__uint32 sVar12;
  uint uVar13;
  int depth;
  int iVar14;
  int iVar15;
  char *pcVar16;
  stbi_uc *psVar17;
  stbi_uc *psVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  stbi_uc *psVar22;
  int out_n;
  int iVar23;
  ushort uVar24;
  uint uVar25;
  uint uVar26;
  byte bVar27;
  uint y;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  size_t sVar31;
  uint x;
  uint uVar32;
  long in_FS_OFFSET;
  bool bVar33;
  stbi_uc tc [3];
  stbi__uint16 tc16 [3];
  stbi__uint32 local_478;
  ulong local_470;
  stbi__uint32 raw_len;
  ulong local_458;
  long local_450;
  stbi_uc *local_448;
  long local_440;
  stbi_uc palette [1024];
  
  tc[0] = '\0';
  tc[1] = '\0';
  tc[2] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar10 = stbi__check_png_header(s);
  if (iVar10 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar7 = 0;
  local_470 = 0;
  bVar5 = false;
  bVar33 = true;
  uVar26 = 0;
  uVar13 = 0;
  uVar32 = 0;
  bVar4 = false;
  bVar27 = 0;
  do {
    sVar11 = stbi__get32be(s);
    uVar21 = (ulong)sVar11;
    sVar12 = stbi__get32be(s);
    bVar6 = true;
    if (sVar12 == 0x43674249) {
LAB_0013c691:
      stbi__skip(s,sVar11);
      bVar5 = bVar6;
    }
    else if (sVar12 == 0x49444154) {
      if (bVar33) goto LAB_0013c97d;
      if ((bVar27 != 0) && (uVar26 == 0)) {
        pcVar16 = "no PLTE";
        goto LAB_0013c984;
      }
      if (scan == 2) {
        s->img_n = (uint)bVar27;
        return 1;
      }
      uVar30 = uVar32 + sVar11;
      if ((int)uVar30 < (int)uVar32) {
        return 0;
      }
      if (uVar13 < uVar30) {
        if (sVar11 < 0x1001) {
          uVar21 = 0x1000;
        }
        if (uVar13 != 0) {
          uVar21 = (ulong)uVar13;
        }
        do {
          sVar31 = uVar21;
          uVar13 = (uint)sVar31;
          uVar21 = (ulong)(uVar13 * 2);
        } while (uVar13 < uVar30);
        psVar17 = (stbi_uc *)realloc(*ppsVar1,sVar31);
        if (psVar17 == (stbi_uc *)0x0) goto LAB_0013d030;
        *ppsVar1 = psVar17;
      }
      else {
        psVar17 = *ppsVar1;
      }
      iVar10 = stbi__getn(s,psVar17 + uVar32,sVar11);
      if (iVar10 == 0) {
        pcVar16 = "outofdata";
        goto LAB_0013c984;
      }
      bVar33 = false;
      uVar32 = uVar30;
    }
    else {
      if (sVar12 != 0x49484452) {
        if (sVar12 == 0x504c5445) {
          if (!bVar33) {
            if ((sVar11 < 0x301) && (uVar26 = (sVar11 & 0xffff) / 3, uVar26 * 3 == sVar11)) {
              for (uVar21 = 0; uVar26 != uVar21; uVar21 = uVar21 + 1) {
                sVar9 = stbi__get8(s);
                palette[uVar21 * 4] = sVar9;
                sVar9 = stbi__get8(s);
                palette[uVar21 * 4 + 1] = sVar9;
                sVar9 = stbi__get8(s);
                palette[uVar21 * 4 + 2] = sVar9;
                palette[uVar21 * 4 + 3] = 0xff;
              }
LAB_0013c7ac:
              bVar33 = false;
              goto LAB_0013c943;
            }
            pcVar16 = "invalid PLTE";
            goto LAB_0013c984;
          }
        }
        else if (sVar12 == 0x74524e53) {
          if (!bVar33) {
            if (*ppsVar1 == (stbi_uc *)0x0) {
              if (bVar27 == 0) {
                uVar30 = s->img_n;
                if ((uVar30 & 1) == 0) {
                  pcVar16 = "tRNS with alpha";
                  goto LAB_0013c984;
                }
                if (uVar30 * 2 == sVar11) {
                  if (z->depth == 0x10) {
                    for (lVar29 = 0; lVar29 < (int)uVar30; lVar29 = lVar29 + 1) {
                      iVar10 = stbi__get16be(s);
                      tc16[lVar29] = (stbi__uint16)iVar10;
                      uVar30 = s->img_n;
                    }
                  }
                  else {
                    for (lVar29 = 0; lVar29 < (int)uVar30; lVar29 = lVar29 + 1) {
                      iVar10 = stbi__get16be(s);
                      tc[lVar29] = ""[z->depth] * (char)iVar10;
                      uVar30 = s->img_n;
                    }
                  }
                  bVar4 = true;
                  bVar33 = false;
                  bVar27 = 0;
                  goto LAB_0013c943;
                }
              }
              else {
                if (scan == 2) {
                  s->img_n = 4;
                  return 1;
                }
                if (uVar26 == 0) {
                  pcVar16 = "tRNS before PLTE";
                  goto LAB_0013c984;
                }
                if (sVar11 <= uVar26) {
                  for (uVar28 = 0; uVar21 != uVar28; uVar28 = uVar28 + 1) {
                    sVar9 = stbi__get8(s);
                    palette[uVar28 * 4 + 3] = sVar9;
                  }
                  bVar27 = 4;
                  goto LAB_0013c7ac;
                }
              }
              pcVar16 = "bad tRNS len";
              goto LAB_0013c984;
            }
            pcVar16 = "tRNS after IDAT";
            goto LAB_0013c984;
          }
        }
        else if (sVar12 == 0x49454e44) {
          if (!bVar33) {
            if (scan != 0) {
              return 1;
            }
            if (*ppsVar1 != (stbi_uc *)0x0) {
              raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
              psVar17 = (stbi_uc *)
                        stbi_zlib_decode_malloc_guesssize_headerflag
                                  ((char *)*ppsVar1,uVar32,raw_len,(int *)&raw_len,(uint)!bVar5);
              z->expanded = psVar17;
              if (psVar17 == (stbi_uc *)0x0) {
                return 0;
              }
              free(z->idata);
              z->idata = (stbi_uc *)0x0;
              iVar10 = s->img_n + 1;
              iVar23 = s->img_n;
              if (bVar4) {
                iVar23 = iVar10;
              }
              out_n = iVar23;
              if (req_comp != 3) {
                out_n = iVar10;
              }
              if (bVar27 != 0) {
                out_n = iVar23;
              }
              if (iVar10 != req_comp) {
                out_n = iVar23;
              }
              s->img_out_n = out_n;
              psVar17 = z->expanded;
              uVar26 = z->depth;
              local_458 = (ulong)uVar26;
              iVar10 = out_n << (uVar26 == 0x10);
              sVar11 = z->s->img_x;
              sVar12 = z->s->img_y;
              iVar23 = (int)local_470;
              if (bVar7 == 0) {
                iVar10 = stbi__create_png_image_raw
                                   (z,psVar17,raw_len,out_n,sVar11,sVar12,uVar26,iVar23);
                if (iVar10 == 0) {
                  return 0;
                }
              }
              else {
                local_478 = raw_len;
                psVar18 = (stbi_uc *)stbi__malloc_mad3(sVar11,sVar12,iVar10,raw_len);
                sVar31 = (size_t)iVar10;
                local_470 = extraout_RDX;
                for (lVar29 = 0; lVar29 != 7; lVar29 = lVar29 + 1) {
                  psVar2 = z->s;
                  uVar26 = (&DAT_0015c2e0)[lVar29];
                  uVar32 = (&DAT_0015c320)[lVar29];
                  uVar25 = ~uVar26 + psVar2->img_x + uVar32;
                  x = uVar25 / uVar32;
                  uVar13 = (&DAT_0015c300)[lVar29];
                  uVar30 = (&DAT_0015c340)[lVar29];
                  uVar19 = ~uVar13 + psVar2->img_y + uVar30;
                  y = uVar19 / uVar30;
                  local_470 = (ulong)uVar19 % (ulong)uVar30;
                  if ((uVar32 <= uVar25) && (uVar30 <= uVar19)) {
                    depth = (int)local_458;
                    iVar15 = psVar2->img_n;
                    local_448 = psVar17;
                    iVar14 = stbi__create_png_image_raw(z,psVar17,local_478,out_n,x,y,depth,iVar23);
                    if (iVar14 == 0) {
                      free(psVar18);
                      return 0;
                    }
                    uVar19 = (((int)(x * depth * iVar15 + 7) >> 3) + 1) * y;
                    local_440 = (long)(int)y;
                    iVar15 = uVar13 * iVar10;
                    local_450 = lVar29;
                    for (lVar20 = 0; lVar20 < local_440; lVar20 = lVar20 + 1) {
                      psVar17 = psVar18 + (long)(int)uVar26 * sVar31;
                      for (lVar29 = 0; lVar29 < (int)x; lVar29 = lVar29 + 1) {
                        memcpy(psVar17 + z->s->img_x * iVar15,
                               z->out + (lVar29 + lVar20 * (int)x) * sVar31,sVar31);
                        psVar17 = psVar17 + (long)(int)uVar32 * sVar31;
                      }
                      iVar15 = iVar15 + uVar30 * iVar10;
                    }
                    free(z->out);
                    psVar17 = local_448 + uVar19;
                    local_478 = local_478 - uVar19;
                    local_470 = extraout_RDX_00;
                    lVar29 = local_450;
                  }
                }
                z->out = psVar18;
              }
              if (bVar4) {
                psVar17 = z->out;
                iVar23 = z->s->img_y * z->s->img_x;
                iVar10 = s->img_out_n;
                if (z->depth == 0x10) {
                  if (iVar10 == 4) {
                    local_470 = (ulong)tc16[0];
                    for (lVar29 = 0; iVar23 != (int)lVar29; lVar29 = lVar29 + 1) {
                      if (((*(stbi__uint16 *)(psVar17 + lVar29 * 8) == tc16[0]) &&
                          (*(stbi__uint16 *)(psVar17 + lVar29 * 8 + 2) == tc16[1])) &&
                         (*(stbi__uint16 *)(psVar17 + lVar29 * 8 + 4) == tc16[2])) {
                        (psVar17 + lVar29 * 8 + 6)[0] = '\0';
                        (psVar17 + lVar29 * 8 + 6)[1] = '\0';
                      }
                    }
                  }
                  else {
                    if (iVar10 != 2) {
                      __assert_fail("out_n == 2 || out_n == 4",
                                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                                    ,0x12dc,
                                    "int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)"
                                   );
                    }
                    local_470 = (ulong)tc16[0];
                    for (lVar29 = 0; iVar23 != (int)lVar29; lVar29 = lVar29 + 1) {
                      *(ushort *)(psVar17 + lVar29 * 4 + 2) =
                           -(ushort)(*(stbi__uint16 *)(psVar17 + lVar29 * 4) != tc16[0]);
                    }
                  }
                }
                else {
                  uVar3 = (undefined3)((uint)iVar10 >> 8);
                  if (iVar10 == 4) {
                    local_470 = (ulong)CONCAT31(uVar3,tc[0]);
                    for (lVar29 = 0; iVar23 != (int)lVar29; lVar29 = lVar29 + 1) {
                      if (((psVar17[lVar29 * 4] == tc[0]) && (psVar17[lVar29 * 4 + 1] == tc[1])) &&
                         (psVar17[lVar29 * 4 + 2] == tc[2])) {
                        psVar17[lVar29 * 4 + 3] = '\0';
                      }
                    }
                  }
                  else {
                    if (iVar10 != 2) {
                      __assert_fail("out_n == 2 || out_n == 4",
                                    "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                                    ,0x12c3,
                                    "int stbi__compute_transparency(stbi__png *, stbi_uc *, int)");
                    }
                    local_470 = (ulong)CONCAT31(uVar3,tc[0]);
                    for (lVar29 = 0; iVar23 != (int)lVar29; lVar29 = lVar29 + 1) {
                      psVar17[lVar29 * 2 + 1] = -(psVar17[lVar29 * 2] != tc[0]);
                    }
                  }
                }
              }
              if (((bVar5) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                psVar2 = z->s;
                psVar17 = z->out;
                uVar26 = psVar2->img_out_n;
                local_470 = (ulong)uVar26;
                iVar10 = psVar2->img_y * psVar2->img_x;
                if (uVar26 == 4) {
                  if (stbi__unpremultiply_on_load == 0) {
                    for (local_470 = 0; iVar10 != (int)local_470; local_470 = local_470 + 1) {
                      sVar9 = psVar17[local_470 * 4];
                      psVar17[local_470 * 4] = psVar17[local_470 * 4 + 2];
                      psVar17[local_470 * 4 + 2] = sVar9;
                    }
                  }
                  else {
                    for (lVar29 = 0; iVar10 != (int)lVar29; lVar29 = lVar29 + 1) {
                      bVar7 = psVar17[lVar29 * 4 + 3];
                      bVar8 = psVar17[lVar29 * 4];
                      if (bVar7 == 0) {
                        local_470 = CONCAT71((int7)(local_470 >> 8),psVar17[lVar29 * 4 + 2]);
                        psVar17[lVar29 * 4] = psVar17[lVar29 * 4 + 2];
                        psVar17[lVar29 * 4 + 2] = bVar8;
                      }
                      else {
                        uVar26 = (uint)(bVar7 >> 1);
                        uVar24 = (ushort)bVar7;
                        psVar17[lVar29 * 4] =
                             (stbi_uc)(((uint)psVar17[lVar29 * 4 + 2] * 0xff + uVar26 & 0xffff) /
                                      (uint)uVar24);
                        psVar17[lVar29 * 4 + 1] =
                             (stbi_uc)(((uint)psVar17[lVar29 * 4 + 1] * 0xff + uVar26 & 0xffff) /
                                      (uint)uVar24);
                        uVar26 = (uint)bVar8 * 0xff + uVar26 & 0xffff;
                        local_470 = (ulong)(ushort)(uVar26 % (uint)uVar24);
                        psVar17[lVar29 * 4 + 2] = (stbi_uc)(uVar26 / uVar24);
                      }
                    }
                  }
                }
                else {
                  if (uVar26 != 3) {
                    __assert_fail("s->img_out_n == 4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                                  ,0x132d,"void stbi__de_iphone(stbi__png *)");
                  }
                  while (bVar33 = iVar10 != 0, iVar10 = iVar10 + -1, bVar33) {
                    sVar9 = *psVar17;
                    local_470 = CONCAT71((int7)(local_470 >> 8),sVar9);
                    *psVar17 = psVar17[2];
                    psVar17[2] = sVar9;
                    psVar17 = psVar17 + 3;
                  }
                }
              }
              if (bVar27 == 0) {
                if (bVar4) {
                  s->img_n = s->img_n + 1;
                }
LAB_0013d078:
                free(z->expanded);
                z->expanded = (stbi_uc *)0x0;
                stbi__get32be(s);
                return 1;
              }
              s->img_n = (uint)bVar27;
              uVar26 = (uint)bVar27;
              if (2 < req_comp) {
                uVar26 = req_comp;
              }
              s->img_out_n = uVar26;
              psVar17 = z->out;
              uVar32 = z->s->img_y * z->s->img_x;
              psVar18 = (stbi_uc *)stbi__malloc_mad2(uVar32,uVar26,(int)local_470);
              if (psVar18 != (stbi_uc *)0x0) {
                uVar21 = 0;
                psVar22 = psVar18;
                if (uVar26 == 3) {
                  for (; uVar32 != uVar21; uVar21 = uVar21 + 1) {
                    uVar28 = (ulong)psVar17[uVar21];
                    *psVar22 = palette[uVar28 * 4];
                    psVar22[1] = palette[uVar28 * 4 + 1];
                    psVar22[2] = palette[uVar28 * 4 + 2];
                    psVar22 = psVar22 + 3;
                  }
                }
                else {
                  for (; uVar32 != uVar21; uVar21 = uVar21 + 1) {
                    *(undefined4 *)(psVar18 + uVar21 * 4) =
                         *(undefined4 *)(palette + (ulong)psVar17[uVar21] * 4);
                  }
                }
                free(psVar17);
                z->out = psVar18;
                goto LAB_0013d078;
              }
LAB_0013d030:
              pcVar16 = "outofmem";
              goto LAB_0013c984;
            }
            pcVar16 = "no IDAT";
            goto LAB_0013c984;
          }
        }
        else if (!bVar33) {
          bVar33 = false;
          bVar6 = bVar5;
          if ((sVar12 >> 0x1d & 1) == 0) {
            stbi__parse_png_file::invalid_chunk._0_4_ =
                 sVar12 >> 0x18 | (sVar12 & 0xff0000) >> 8 | (sVar12 & 0xff00) << 8 | sVar12 << 0x18
            ;
            *(char **)(in_FS_OFFSET + -0x10) = stbi__parse_png_file::invalid_chunk;
            return 0;
          }
          goto LAB_0013c691;
        }
LAB_0013c97d:
        pcVar16 = "first not IHDR";
        goto LAB_0013c984;
      }
      if (!bVar33) {
        pcVar16 = "multiple IHDR";
        goto LAB_0013c984;
      }
      if (sVar11 != 0xd) {
        pcVar16 = "bad IHDR len";
        goto LAB_0013c984;
      }
      sVar11 = stbi__get32be(s);
      s->img_x = sVar11;
      sVar11 = stbi__get32be(s);
      s->img_y = sVar11;
      if ((0x1000000 < sVar11) || (0x1000000 < s->img_x)) {
LAB_0013c950:
        pcVar16 = "too large";
LAB_0013c984:
        *(char **)(in_FS_OFFSET + -0x10) = pcVar16;
        return 0;
      }
      bVar7 = stbi__get8(s);
      z->depth = (uint)bVar7;
      if ((0x10 < bVar7) || ((0x10116U >> (bVar7 & 0x1f) & 1) == 0)) {
        pcVar16 = "1/2/4/8/16-bit only";
        goto LAB_0013c984;
      }
      bVar8 = stbi__get8(s);
      if (6 < bVar8) {
LAB_0013c962:
        pcVar16 = "bad ctype";
        goto LAB_0013c984;
      }
      local_470 = (ulong)bVar8;
      if (bVar8 == 3) {
        bVar27 = 3;
        if (z->depth == 0x10) goto LAB_0013c962;
      }
      else if ((bVar8 & 1) != 0) goto LAB_0013c962;
      sVar9 = stbi__get8(s);
      if (sVar9 != '\0') {
        pcVar16 = "bad comp method";
        goto LAB_0013c984;
      }
      sVar9 = stbi__get8(s);
      if (sVar9 != '\0') {
        pcVar16 = "bad filter method";
        goto LAB_0013c984;
      }
      bVar7 = stbi__get8(s);
      if (1 < bVar7) {
        pcVar16 = "bad interlace method";
        goto LAB_0013c984;
      }
      uVar30 = s->img_x;
      if ((uVar30 == 0) || (uVar19 = s->img_y, uVar19 == 0)) {
        pcVar16 = "0-pixel image";
        goto LAB_0013c984;
      }
      if (bVar27 == 0) {
        uVar25 = (uint)(3 < bVar8) + (bVar8 & 2) + 1;
        s->img_n = uVar25;
        if ((uint)((0x40000000 / (ulong)uVar30) / (ulong)uVar25) < uVar19) goto LAB_0013c950;
        bVar33 = false;
        bVar27 = 0;
        if (scan == 2) {
          return 1;
        }
      }
      else {
        s->img_n = 1;
        bVar33 = false;
        if ((uint)(0x40000000 / (ulong)uVar30 >> 2) < uVar19) goto LAB_0013c950;
      }
    }
LAB_0013c943:
    stbi__get32be(s);
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}